

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::FindPointerToType
          (TypeManager *this,uint32_t type_id,StorageClass storage_class)

{
  bool bVar1;
  uint32_t uVar2;
  StorageClass SVar3;
  Type *type;
  Instruction *pIVar4;
  pointer pOVar5;
  Module *this_00;
  Instruction *type_inst;
  SmallVector<unsigned_int,_2UL> *this_01;
  IRContext *pIVar6;
  Operand *__cur;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_02;
  uint32_t unaff_R15D;
  long lVar7;
  size_type __dnew;
  string message;
  Pointer pointerTy;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_138;
  undefined1 local_118 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  undefined1 local_f0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_d0;
  size_t *local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  undefined4 local_98;
  undefined1 local_90 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  Pointer local_68;
  
  type = GetType(this,type_id);
  Pointer::Pointer(&local_68,type,storage_class);
  pIVar6 = this->context_;
  this_00 = (pIVar6->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar4 = *(Instruction **)
            ((long)&(this_00->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  if (pIVar4 != (Instruction *)
                ((long)&(this_00->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                8U)) {
    do {
      bVar1 = true;
      if (((pIVar4->opcode_ == OpTypePointer) &&
          (uVar2 = Instruction::GetSingleWordOperand(pIVar4,2), uVar2 == type_id)) &&
         (SVar3 = Instruction::GetSingleWordOperand(pIVar4,1), SVar3 == storage_class)) {
        bVar1 = false;
        unaff_R15D = 0;
        if (pIVar4->has_result_id_ == true) {
          unaff_R15D = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
          bVar1 = false;
        }
      }
      if (!bVar1) goto LAB_005117c0;
      pIVar4 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar6 = this->context_;
      this_00 = (pIVar6->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    } while (pIVar4 != (Instruction *)
                       ((long)&(this_00->types_values_).
                               super_IntrusiveList<spvtools::opt::Instruction> + 8U));
  }
  unaff_R15D = Module::TakeNextIdBound(this_00);
  if ((unaff_R15D == 0) &&
     ((pIVar6->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_c8 = &local_c0.size_;
    local_118._0_8_ = (_func_int **)0x25;
    local_c8 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)local_118);
    local_c0.size_ = local_118._0_8_;
    *local_c8 = 0x667265766f204449;
    local_c8[1] = 0x797254202e776f6c;
    local_c8[2] = 0x676e696e6e757220;
    local_c8[3] = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_c8 + 0x1d),"act-ids.",8);
    local_c0._vptr_SmallVector = (_func_int **)local_118._0_8_;
    *(char *)((long)local_c8 + local_118._0_8_) = '\0';
    local_118._0_8_ = (_func_int **)0x0;
    local_118._8_8_ = 0;
    local_118._16_4_ = (array<signed_char,_4UL>)0x0;
    local_118._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar6->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_118,(char *)local_c8);
    if (local_c8 != &local_c0.size_) {
      operator_delete(local_c8,local_c0.size_ + 1);
    }
  }
  if (unaff_R15D == 0) {
    unaff_R15D = 0;
  }
  else {
    pIVar4 = (Instruction *)operator_new(0x70);
    pIVar6 = this->context_;
    local_118._24_8_ = local_118 + 0x10;
    local_118._0_8_ = &PTR__SmallVector_00b15d78;
    local_f8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_118._16_4_ = storage_class;
    local_118._8_8_ = 1;
    this_01 = &local_c0;
    local_c8 = (size_t *)CONCAT44(local_c8._4_4_,0x11);
    local_c0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
    local_c0.size_ = 0;
    local_c0.small_data_ = (uint *)local_c0.buffer;
    local_c0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (this_01,(SmallVector<unsigned_int,_2UL> *)local_118);
    local_f0._24_8_ = local_f0 + 0x10;
    local_f0._0_8_ = &PTR__SmallVector_00b15d78;
    local_d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_f0._8_8_ = 1;
    local_98 = 1;
    local_90._0_8_ = &PTR__SmallVector_00b15d78;
    local_90._8_8_ = 0;
    local_90._24_8_ = local_90 + 0x10;
    local_70._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_f0._16_4_ = type_id;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_90,(SmallVector<unsigned_int,_2UL> *)local_f0
              );
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x60;
    pOVar5 = (pointer)operator_new(0x60);
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar5 + 2;
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar5;
    do {
      pOVar5->type = *(spv_operand_type_t *)
                      &this_01[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar5->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
      (pOVar5->words).size_ = 0;
      (pOVar5->words).small_data_ = (uint *)(pOVar5->words).buffer;
      (pOVar5->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar5->words,this_01);
      pOVar5 = pOVar5 + 1;
      this_01 = (SmallVector<unsigned_int,_2UL> *)&this_01[1].size_;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
    local_138.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar5;
    Instruction::Instruction(pIVar4,pIVar6,OpTypePointer,0,unaff_R15D,&local_138);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_138);
    lVar7 = -0x60;
    this_02 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_70
    ;
    do {
      *(undefined ***)(this_02 + -0x20) = &PTR__SmallVector_00b15d78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_02 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_02,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_02);
      }
      *(undefined8 *)this_02 = 0;
      this_02 = this_02 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
    local_f0._0_8_ = &PTR__SmallVector_00b15d78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_d0,local_d0._M_head_impl);
    }
    local_118._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_f8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_f8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_f8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    pIVar6 = this->context_;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar6->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                types_values_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar4);
    if ((pIVar6->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      DefUseManager::AnalyzeInstDefUse
                ((pIVar6->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 *(Instruction **)
                  ((long)&(((pIVar6->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18));
    }
    pIVar6 = this->context_;
    if ((pIVar6->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar6);
    }
    RegisterType((pIVar6->type_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl,
                 unaff_R15D,&local_68.super_Type);
  }
LAB_005117c0:
  local_68.super_Type._vptr_Type = (_func_int **)&PTR__Type_00b16068;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_68.super_Type.decorations_);
  return unaff_R15D;
}

Assistant:

uint32_t TypeManager::FindPointerToType(uint32_t type_id,
                                        spv::StorageClass storage_class) {
  Type* pointeeTy = GetType(type_id);
  Pointer pointerTy(pointeeTy, storage_class);

  Module::inst_iterator type_itr = context()->module()->types_values_begin();
  for (; type_itr != context()->module()->types_values_end(); ++type_itr) {
    const Instruction* type_inst = &*type_itr;
    if (type_inst->opcode() == spv::Op::OpTypePointer &&
        type_inst->GetSingleWordOperand(kSpvTypePointerTypeIdInIdx) ==
            type_id &&
        spv::StorageClass(type_inst->GetSingleWordOperand(
            kSpvTypePointerStorageClass)) == storage_class)
      return type_inst->result_id();
  }

  // Must create the pointer type.
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return 0;
  }
  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  context()->get_type_mgr()->RegisterType(resultId, pointerTy);
  return resultId;
}